

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_pred.hpp
# Opt level: O0

AssertionResult * __thiscall
iutest::AssertPred4Helper<bool(*)(int,int,int,int),int,int,int,int>
          (AssertionResult *__return_storage_ptr__,iutest *this,char *pred_str,char *expr1,
          char *expr2,char *expr3,char *expr4,_func_bool_int_int_int_int *pred,int val1,int val2,
          int val3,int val4)

{
  byte bVar1;
  AssertionResult *pAVar2;
  AssertionResult local_60;
  char *local_38;
  char *expr4_local;
  char *expr3_local;
  char *expr2_local;
  char *expr1_local;
  char *pred_str_local;
  
  local_38 = expr3;
  expr4_local = expr2;
  expr3_local = expr1;
  expr2_local = pred_str;
  expr1_local = (char *)this;
  pred_str_local = (char *)__return_storage_ptr__;
  bVar1 = (*(code *)expr4)((ulong)pred & 0xffffffff,val1,val2,val3);
  if ((bVar1 & 1) == 0) {
    AssertionFailure();
    pAVar2 = AssertionResult::operator<<(&local_60,(char (*) [8])"error: ");
    pAVar2 = AssertionResult::operator<<(pAVar2,&expr1_local);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [2])0x330db1);
    pAVar2 = AssertionResult::operator<<(pAVar2,&expr2_local);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [3])0x32e0f8);
    pAVar2 = AssertionResult::operator<<(pAVar2,&expr3_local);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [3])0x32e0f8);
    pAVar2 = AssertionResult::operator<<(pAVar2,&expr4_local);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [3])0x32e0f8);
    pAVar2 = AssertionResult::operator<<(pAVar2,&local_38);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [29])") evaluates to false, where ");
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [2])0x32bfc8);
    pAVar2 = AssertionResult::operator<<(pAVar2,&expr2_local);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [4])0x32e023);
    pAVar2 = AssertionResult::operator<<(pAVar2,(int *)&pred);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [2])0x32bfc8);
    pAVar2 = AssertionResult::operator<<(pAVar2,&expr3_local);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [4])0x32e023);
    pAVar2 = AssertionResult::operator<<(pAVar2,&val1);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [2])0x32bfc8);
    pAVar2 = AssertionResult::operator<<(pAVar2,&expr4_local);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [4])0x32e023);
    pAVar2 = AssertionResult::operator<<(pAVar2,&val2);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [2])0x32bfc8);
    pAVar2 = AssertionResult::operator<<(pAVar2,&local_38);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [4])0x32e023);
    pAVar2 = AssertionResult::operator<<(pAVar2,&val3);
    AssertionResult::AssertionResult(__return_storage_ptr__,pAVar2);
    AssertionResult::~AssertionResult(&local_60);
  }
  else {
    AssertionSuccess();
  }
  return __return_storage_ptr__;
}

Assistant:

AssertionResult AssertPred4Helper(const char* pred_str
    , const char* expr1, const char* expr2, const char* expr3, const char* expr4
    , PRED pred, T1 val1, T2 val2, T3 val3, T4 val4)
{
    if IUTEST_COND_LIKELY( (*pred)(val1, val2, val3, val4) )
    {
        return AssertionSuccess();
    }
    return AssertionFailure() << "error: " << pred_str << "("
        << expr1 << ", " << expr2 << ", " << expr3 << ", " << expr4
        << ") evaluates to false, where "
        << "\n" << expr1 << " : " << val1
        << "\n" << expr2 << " : " << val2
        << "\n" << expr3 << " : " << val3
        << "\n" << expr4 << " : " << val4;
}